

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

variant_type __thiscall pstore::uuid::variant(uuid *this)

{
  byte bVar1;
  byte *pbVar2;
  value_type_conflict2 octet;
  uuid *this_local;
  
  pbVar2 = std::array<unsigned_char,_16UL>::operator[](&this->data_,8);
  bVar1 = *pbVar2;
  if ((bVar1 & 0x80) == 0) {
    this_local._4_4_ = ncs;
  }
  else if ((bVar1 & 0xc0) == 0x80) {
    this_local._4_4_ = rfc_4122;
  }
  else if ((bVar1 & 0xe0) == 0xc0) {
    this_local._4_4_ = microsoft;
  }
  else {
    if ((bVar1 & 0xe0) != 0xe0) {
      assert_failed("(octet & 0b11100000) == 0b11100000",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                    ,0xc0);
    }
    this_local._4_4_ = future;
  }
  return this_local._4_4_;
}

Assistant:

auto uuid::variant () const noexcept -> variant_type {
        auto const octet = data_[variant_octet];
        // 0b0xxxxxxx
        if ((octet & 0b10000000) == 0b00000000) { //! OCLINT (PH - bitwise operator is just fine)
            return variant_type::ncs;
        }
        // 0b10xxxxxx
        if ((octet & 0b11000000) == 0b10000000) { //! OCLINT (PH - bitwise operator is just fine)
            return variant_type::rfc_4122;
        }
        // 0b110xxxxx
        if ((octet & 0b11100000) == 0b11000000) { //! OCLINT (PH - bitwise operator is just fine)
            return variant_type::microsoft;
        }
        // 0b111xxxx
        PSTORE_ASSERT ((octet & 0b11100000) ==
                       0b11100000); //! OCLINT (PH - bitwise operator is just fine)
        return variant_type::future;
    }